

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O1

uint bidfx_public_api::tools::HexEncoder::DecodeNibble(uchar c)

{
  ostream *poVar1;
  invalid_argument *this;
  int iVar2;
  stringstream error_message;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar2 = -0x30;
  if (((9 < (byte)(c - 0x30)) && (iVar2 = -0x57, 5 < (byte)(c + 0x9f))) &&
     (iVar2 = -0x37, 5 < (byte)(c + 0xbf))) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"cannot decode non-hex character: ",0x21);
    local_1c0[0] = (string)c;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)local_1c0,1);
    std::endl<char,std::char_traits<char>>(poVar1);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this,local_1c0);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return (uint)c + iVar2;
}

Assistant:

unsigned int HexEncoder::DecodeNibble(unsigned char c)
{
    if (c >= '0' && c <= '9') return c - '0';
    if (c >= 'a' && c <= 'f') return c - 'a' + 10u;
    if (c >= 'A' && c <= 'F') return c - 'A' + 10u;

    std::stringstream error_message;
    error_message << "cannot decode non-hex character: " << c << std::endl;
    throw std::invalid_argument(error_message.str());
}